

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pak.cpp
# Opt level: O2

FResourceFile * CheckPak(char *filename,FileReader *file,bool quiet)

{
  int iVar1;
  FResourceFile *this;
  char head [4];
  
  if (0xb < file->Length) {
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,head,4);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    if (head != (char  [4])0x4b434150) {
      return (FResourceFile *)0x0;
    }
    this = (FResourceFile *)operator_new(0x28);
    FPakFile::FPakFile((FPakFile *)this,filename,file);
    iVar1 = (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile).
              _vptr_FResourceFile[3])(this,quiet);
    if ((char)iVar1 != '\0') {
      return this;
    }
    this->Reader = (FileReader *)0x0;
    (*(((FUncompressedFile *)&this->_vptr_FResourceFile)->super_FResourceFile)._vptr_FResourceFile
      [1])(this);
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckPak(const char *filename, FileReader *file, bool quiet)
{
	char head[4];

	if (file->GetLength() >= 12)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 4);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "PACK", 4))
		{
			FResourceFile *rf = new FPakFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}